

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

String * __thiscall
Diligent::GetShaderStagesString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,SHADER_TYPE ShaderStages)

{
  char (*in_RCX) [18];
  ulong uVar1;
  SHADER_TYPE ShaderType;
  bool bVar2;
  string msg;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)this != 0) {
    uVar1 = (ulong)this & 0xffffffff;
    ShaderType = SHADER_TYPE_VERTEX;
    do {
      if ((ShaderType & (SHADER_TYPE)uVar1) != SHADER_TYPE_UNKNOWN) {
        if (__return_storage_ptr__->_M_string_length != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        GetShaderTypeLiteralName(ShaderType);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        uVar1 = (ulong)((SHADER_TYPE)uVar1 & ~ShaderType);
      }
    } while (((int)uVar1 != 0) &&
            (bVar2 = ShaderType < (SHADER_TYPE_CALLABLE|SHADER_TYPE_VERTEX),
            ShaderType = ShaderType * 2, bVar2));
    if ((int)uVar1 != 0) {
      FormatString<char[26],char[18]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"ShaderStages == 0",in_RCX);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"GetShaderStagesString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x336);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetShaderStagesString(SHADER_TYPE ShaderStages)
{
    String StagesStr;
    for (Uint32 Stage = SHADER_TYPE_VERTEX; ShaderStages != 0 && Stage <= SHADER_TYPE_LAST; Stage <<= 1)
    {
        if (ShaderStages & Stage)
        {
            if (StagesStr.length())
                StagesStr += ", ";
            StagesStr += GetShaderTypeLiteralName(static_cast<SHADER_TYPE>(Stage));
            ShaderStages &= ~static_cast<SHADER_TYPE>(Stage);
        }
    }
    VERIFY_EXPR(ShaderStages == 0);
    return StagesStr;
}